

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ValueNode * __thiscall DL::Parser::gr_value(Parser *this)

{
  SourceLogger *pSVar1;
  bool bVar2;
  line_t lVar3;
  column_t cVar4;
  ValueNode *this_00;
  StatementNode *pSVar5;
  ExpressionNode *pEVar6;
  ostream *poVar7;
  char *pcVar8;
  string local_6b0 [32];
  Token local_690;
  stringstream local_668 [8];
  stringstream stream;
  ostream local_658 [376];
  Token local_4e0;
  Token local_4b8;
  undefined1 local_490 [8];
  Token str_2;
  undefined1 local_2e8 [8];
  Token str_1;
  istringstream local_2b0 [384];
  undefined1 local_130 [8];
  Token str;
  Token local_e0;
  Token local_b8;
  Token local_90;
  Token local_68;
  Token local_40;
  ValueNode *local_18;
  ValueNode *node;
  Parser *this_local;
  
  node = (ValueNode *)this;
  this_00 = (ValueNode *)operator_new(0x30);
  ValueNode::ValueNode(this_00);
  local_18 = this_00;
  bVar2 = lookahead(this,T_OpenParanthese);
  if (bVar2) {
    match(&local_40,this,T_OpenParanthese);
    Token::~Token(&local_40);
    local_18->Type = VNT_Statement;
    pSVar5 = gr_statement(this);
    (local_18->field_1)._Statement = pSVar5;
    match(&local_68,this,T_CloseParanthese);
    Token::~Token(&local_68);
  }
  else {
    bVar2 = lookahead(this,T_OpenSquareBracket);
    if (bVar2) {
      match(&local_90,this,T_OpenSquareBracket);
      Token::~Token(&local_90);
      local_18->Type = VNT_Statement;
      pSVar5 = gr_array(this);
      (local_18->field_1)._Statement = pSVar5;
      match(&local_b8,this,T_CloseSquareBracket);
      Token::~Token(&local_b8);
    }
    else {
      bVar2 = lookahead(this,T_ExpressionParanthese);
      if (bVar2) {
        match(&local_e0,this,T_ExpressionParanthese);
        Token::~Token(&local_e0);
        local_18->Type = VNT_Expression;
        pEVar6 = gr_expression(this);
        (local_18->field_1)._Expression = pEVar6;
        match((Token *)&str.field_0x20,this,T_CloseParanthese);
        Token::~Token((Token *)&str.field_0x20);
      }
      else {
        bVar2 = lookahead(this,T_Integer);
        if (bVar2) {
          match((Token *)local_130,this,T_Integer);
          local_18->Type = VNT_Integer;
          std::__cxx11::istringstream::istringstream(local_2b0,(string *)&str,_S_in);
          std::operator>>((basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                           *)local_2b0,&(local_18->field_1)._Integer);
          std::__cxx11::istringstream::~istringstream(local_2b0);
          Token::~Token((Token *)local_130);
        }
        else {
          bVar2 = lookahead(this,T_Float);
          if (bVar2) {
            match((Token *)local_2e8,this,T_Float);
            local_18->Type = VNT_Float;
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)&str_2.field_0x20,(string *)&str_1,_S_in);
            std::operator>>((basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)&str_2.field_0x20,&(local_18->field_1)._Float);
            std::__cxx11::istringstream::~istringstream((istringstream *)&str_2.field_0x20);
            Token::~Token((Token *)local_2e8);
          }
          else {
            bVar2 = lookahead(this,T_String);
            if (bVar2) {
              match((Token *)local_490,this,T_String);
              local_18->Type = VNT_String;
              std::__cxx11::string::operator=((string *)&local_18->_String,(string *)&str_2);
              Token::~Token((Token *)local_490);
            }
            else {
              bVar2 = lookahead(this,T_True);
              if (bVar2) {
                match(&local_4b8,this,T_True);
                Token::~Token(&local_4b8);
                local_18->Type = VNT_Boolean;
                (local_18->field_1)._Boolean = true;
              }
              else {
                bVar2 = lookahead(this,T_False);
                if (bVar2) {
                  match(&local_4e0,this,T_False);
                  Token::~Token(&local_4e0);
                  local_18->Type = VNT_Boolean;
                  (local_18->field_1)._Boolean = false;
                }
                else {
                  local_18->Type = VNT_Unknown;
                  std::__cxx11::stringstream::stringstream(local_668);
                  poVar7 = std::operator<<(local_658,"INTERNAL: Unknown lookahead \'");
                  Lexer::look(&local_690,&this->mLexer);
                  pcVar8 = tokenToString(local_690.Type);
                  poVar7 = std::operator<<(poVar7,pcVar8);
                  std::operator<<(poVar7,"\' for values.");
                  Token::~Token(&local_690);
                  pSVar1 = this->mLogger;
                  lVar3 = Lexer::currentLine(&this->mLexer);
                  cVar4 = Lexer::currentColumn(&this->mLexer);
                  std::__cxx11::stringstream::str();
                  (*pSVar1->_vptr_SourceLogger[2])(pSVar1,(ulong)lVar3,(ulong)cVar4,4,local_6b0);
                  std::__cxx11::string::~string(local_6b0);
                  std::__cxx11::stringstream::~stringstream(local_668);
                }
              }
            }
          }
        }
      }
    }
  }
  return local_18;
}

Assistant:

ValueNode* Parser::gr_value()
{
	ValueNode* node = new ValueNode;

	if (lookahead(T_OpenParanthese)) {
		match(T_OpenParanthese);

		node->Type		 = VNT_Statement;
		node->_Statement = gr_statement();

		match(T_CloseParanthese);
	} else if (lookahead(T_OpenSquareBracket)) // Anonymous group
	{
		match(T_OpenSquareBracket);

		node->Type		 = VNT_Statement;
		node->_Statement = gr_array();

		match(T_CloseSquareBracket);
	} else if (lookahead(T_ExpressionParanthese)) {
		match(T_ExpressionParanthese);

		node->Type		  = VNT_Expression;
		node->_Expression = gr_expression();

		match(T_CloseParanthese);
	} else if (lookahead(T_Integer)) {
		Token str = match(T_Integer);

		node->Type = VNT_Integer;
		std::istringstream(str.Value) >> node->_Integer;
	} else if (lookahead(T_Float)) {
		Token str = match(T_Float);

		node->Type = VNT_Float;
		std::istringstream(str.Value) >> node->_Float;
	} else if (lookahead(T_String)) {
		Token str = match(T_String);

		node->Type	= VNT_String;
		node->_String = str.Value;
	} else if (lookahead(T_True)) {
		match(T_True);

		node->Type	 = VNT_Boolean;
		node->_Boolean = true;
	} else if (lookahead(T_False)) {
		match(T_False);

		node->Type	 = VNT_Boolean;
		node->_Boolean = false;
	} else {
		node->Type = VNT_Unknown;

		std::stringstream stream;
		stream << "INTERNAL: Unknown lookahead '" << tokenToString(mLexer.look().Type) << "' for values.";
		mLogger->log(mLexer.currentLine(), mLexer.currentColumn(), L_Fatal, stream.str());
	}

	return node;
}